

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O0

void assertFailureCallback(char *expr,char *file,int line)

{
  int line_local;
  char *file_local;
  char *expr_local;
  
  qpCrashInfo_set(&g_crashHandler->crashInfo,QP_CRASHTYPE_ASSERT,expr,file,line);
  if (g_crashHandler->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*g_crashHandler->crashHandlerFunc)(g_crashHandler,g_crashHandler->handlerUserPointer);
  }
  return;
}

Assistant:

static void assertFailureCallback (const char* expr, const char* file, int line)
{
	/* Store info. */
	qpCrashInfo_set(&g_crashHandler->crashInfo, QP_CRASHTYPE_ASSERT, expr, file, line);

	/* Handle the crash. */
	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}